

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_convolver_test_utils.cpp
# Opt level: O0

void fade_up(float *out,float *in,size_t n)

{
  float local_40;
  float local_38;
  ulong uStack_30;
  float a_v;
  size_t i;
  float i_scale;
  size_t n_local;
  float *in_local;
  float *out_local;
  
  local_38 = (float)n;
  for (uStack_30 = 0; uStack_30 < n; uStack_30 = uStack_30 + 1) {
    local_40 = (float)uStack_30;
    out[uStack_30] = local_40 * (1.0 / local_38) * in[uStack_30];
  }
  return;
}

Assistant:

void fade_up(float *out, float *in, size_t n) {
  float i_scale = 1.0f / n;

  for (size_t i = 0; i < n; i++) {
    float a_v = (float)i * i_scale;
    out[i] = a_v * in[i];
  }
}